

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000009beb20 = 0x2d2d2d2d2d2d2d;
    uRam00000000009beb27._0_1_ = '-';
    uRam00000000009beb27._1_1_ = '-';
    uRam00000000009beb27._2_1_ = '-';
    uRam00000000009beb27._3_1_ = '-';
    uRam00000000009beb27._4_1_ = '-';
    uRam00000000009beb27._5_1_ = '-';
    uRam00000000009beb27._6_1_ = '-';
    uRam00000000009beb27._7_1_ = '-';
    DAT_009beb10 = '-';
    DAT_009beb10_1._0_1_ = '-';
    DAT_009beb10_1._1_1_ = '-';
    DAT_009beb10_1._2_1_ = '-';
    DAT_009beb10_1._3_1_ = '-';
    DAT_009beb10_1._4_1_ = '-';
    DAT_009beb10_1._5_1_ = '-';
    DAT_009beb10_1._6_1_ = '-';
    uRam00000000009beb18 = 0x2d2d2d2d2d2d2d;
    DAT_009beb1f = 0x2d;
    DAT_009beb00 = '-';
    DAT_009beb00_1._0_1_ = '-';
    DAT_009beb00_1._1_1_ = '-';
    DAT_009beb00_1._2_1_ = '-';
    DAT_009beb00_1._3_1_ = '-';
    DAT_009beb00_1._4_1_ = '-';
    DAT_009beb00_1._5_1_ = '-';
    DAT_009beb00_1._6_1_ = '-';
    uRam00000000009beb08._0_1_ = '-';
    uRam00000000009beb08._1_1_ = '-';
    uRam00000000009beb08._2_1_ = '-';
    uRam00000000009beb08._3_1_ = '-';
    uRam00000000009beb08._4_1_ = '-';
    uRam00000000009beb08._5_1_ = '-';
    uRam00000000009beb08._6_1_ = '-';
    uRam00000000009beb08._7_1_ = '-';
    DAT_009beaf0 = '-';
    DAT_009beaf0_1._0_1_ = '-';
    DAT_009beaf0_1._1_1_ = '-';
    DAT_009beaf0_1._2_1_ = '-';
    DAT_009beaf0_1._3_1_ = '-';
    DAT_009beaf0_1._4_1_ = '-';
    DAT_009beaf0_1._5_1_ = '-';
    DAT_009beaf0_1._6_1_ = '-';
    uRam00000000009beaf8._0_1_ = '-';
    uRam00000000009beaf8._1_1_ = '-';
    uRam00000000009beaf8._2_1_ = '-';
    uRam00000000009beaf8._3_1_ = '-';
    uRam00000000009beaf8._4_1_ = '-';
    uRam00000000009beaf8._5_1_ = '-';
    uRam00000000009beaf8._6_1_ = '-';
    uRam00000000009beaf8._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam00000000009beae8._0_1_ = '-';
    uRam00000000009beae8._1_1_ = '-';
    uRam00000000009beae8._2_1_ = '-';
    uRam00000000009beae8._3_1_ = '-';
    uRam00000000009beae8._4_1_ = '-';
    uRam00000000009beae8._5_1_ = '-';
    uRam00000000009beae8._6_1_ = '-';
    uRam00000000009beae8._7_1_ = '-';
    DAT_009beb2f = 0;
  }
  poVar1 = std::operator<<((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void ConsoleReporter::printSummaryDivider() {
    stream << getLineOfChars<'-'>() << '\n';
}